

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InstancedExpansionShader::shadeFragments
          (InstancedExpansionShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  GenericVec4 *pGVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  
  if (0 < numPackets) {
    pGVar2 = context->outputArray;
    iVar1 = context->numFragmentOutputs;
    iVar3 = 0;
    uVar4 = 0;
    do {
      lVar5 = 4;
      iVar6 = iVar3;
      do {
        *(undefined8 *)&pGVar2[iVar6].v = 0x3f8000003f800000;
        *(undefined8 *)((long)&pGVar2[iVar6].v + 8) = 0x3f8000003f800000;
        iVar6 = iVar6 + iVar1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      uVar4 = uVar4 + 1;
      iVar3 = iVar3 + iVar1 * 4;
    } while (uVar4 != (uint)numPackets);
  }
  return;
}

Assistant:

void InstancedExpansionShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	DE_UNREF(packets);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
}